

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_is_url_absolute(char *url)

{
  char *pcVar1;
  char *pcVar2;
  char *in_RDI;
  char reserved [10];
  char *tmpStr2;
  char *tmpStr1;
  
  pcVar1 = strchr(in_RDI,0x3a);
  if ((((((pcVar1 != (char *)0x0) &&
         ((pcVar2 = strchr(in_RDI,0x3b), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))) &&
        ((pcVar2 = strchr(in_RDI,0x2f), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))) &&
       ((((pcVar2 = strchr(in_RDI,0x3f), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)) &&
         ((pcVar2 = strchr(in_RDI,0x40), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))) &&
        ((pcVar2 = strchr(in_RDI,0x26), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))))) &&
      ((pcVar2 = strchr(in_RDI,0x3d), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))) &&
     ((((pcVar2 = strchr(in_RDI,0x2b), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)) &&
       ((pcVar2 = strchr(in_RDI,0x24), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))) &&
      ((pcVar2 = strchr(in_RDI,0x2c), pcVar2 == (char *)0x0 || (pcVar1 < pcVar2)))))) {
    return 1;
  }
  return 0;
}

Assistant:

int fits_is_url_absolute(char *url)
/*
  Return a True (1) or False (0) value indicating whether or not the passed
  URL string contains an access method specifier or not. Note that this is
  a boolean function and it neither reads nor returns the standard error
  status parameter
*/
{
  char *tmpStr1, *tmpStr2;

  char reserved[] = {':',';','/','?','@','&','=','+','$',','};

  /*
    The rule for determing if an URL is relative or absolute is that it (1)
    must have a colon ":" and (2) that the colon must appear before any other
    reserved URL character in the URL string. We first see if a colon exists,
    get its position in the string, and then check to see if any of the other
    reserved characters exists and if their position in the string is greater
    than that of the colons. 
   */

  if( (tmpStr1 = strchr(url,reserved[0])) != NULL                       &&
     ((tmpStr2 = strchr(url,reserved[1])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[2])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[3])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[4])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[5])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[6])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[7])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[8])) == NULL || tmpStr2 > tmpStr1) &&
     ((tmpStr2 = strchr(url,reserved[9])) == NULL || tmpStr2 > tmpStr1)   )
    {
      return(1);
    }
  else
    {
      return(0);
    }
}